

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
          (CompiledVm<randomx::LargePageAllocator,_true,_false> *this)

{
  undefined8 *in_RDI;
  JitCompilerX86 *in_stack_00000030;
  VmBase<randomx::LargePageAllocator,_true> *in_stack_ffffffffffffffe0;
  
  VmBase<randomx::LargePageAllocator,_true>::VmBase(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__CompiledVm_001629c8;
  JitCompilerX86::JitCompilerX86(in_stack_00000030);
  JitCompilerX86::enableAll((JitCompilerX86 *)0x13ed0c);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}